

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HttpRequest.cpp
# Opt level: O1

bool __thiscall higan::HttpRequest::SetMethod(HttpRequest *this,char *begin,char *end)

{
  int iVar1;
  HttpRequestMethod HVar2;
  bool bVar3;
  size_type *local_40;
  string method;
  
  local_40 = &method._M_string_length;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40);
  iVar1 = std::__cxx11::string::compare((char *)&local_40);
  if (iVar1 == 0) {
    HVar2 = HTTP_REQUEST_GET;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)&local_40);
    if (iVar1 == 0) {
      HVar2 = HTTP_REQUEST_POST;
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)&local_40);
      if (iVar1 == 0) {
        HVar2 = HTTP_REQUEST_PUT;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)&local_40);
        if (iVar1 != 0) {
          bVar3 = false;
          goto LAB_0011c955;
        }
        HVar2 = HTTP_REQUEST_DELETE;
      }
    }
  }
  this->method_ = HVar2;
  bVar3 = true;
LAB_0011c955:
  if (local_40 != &method._M_string_length) {
    operator_delete(local_40,method._M_string_length + 1);
  }
  return bVar3;
}

Assistant:

bool HttpRequest::SetMethod(const char* begin, const char* end)
{
	std::string method(begin, end);

	if (method == "GET")
	{
		method_ = HTTP_REQUEST_GET;
	}
	else if (method == "POST")
	{
		method_ = HTTP_REQUEST_POST;
	}
	else if (method == "PUT")
	{
		method_ = HTTP_REQUEST_PUT;
	}
	else if (method == "DELETE")
	{
		method_ = HTTP_REQUEST_DELETE;
	}
	else
	{
		return false;
	}
	return true;
}